

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
wabt::MakeUnique<wabt::IfExceptExpr>(void)

{
  IfExceptExpr *this;
  __uniq_ptr_data<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>,_true,_true> in_RDI;
  Location local_38;
  
  this = (IfExceptExpr *)operator_new(0x198);
  local_38.field_1.field_0.line = 0;
  local_38.field_1._4_8_ = 0;
  local_38.filename.data_ = (char *)0x0;
  local_38.filename.size_._0_4_ = 0;
  local_38.filename.size_._4_4_ = 0;
  IfExceptExpr::IfExceptExpr(this,&local_38);
  *(IfExceptExpr **)
   in_RDI.super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>._M_t.
   super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>.
   super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>,_true,_true>)
         (tuple<wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>)
         in_RDI.super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>
         .super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}